

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileContext.cpp
# Opt level: O0

CompileResult __thiscall enact::CompileContext::compile(CompileContext *this,string *source)

{
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  *this_00;
  code *pcVar1;
  bool bVar2;
  type stmt_00;
  ostream *poVar3;
  string local_b8;
  reference local_98;
  unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *stmt;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  *__range1;
  undefined1 auStack_68 [8];
  AstSerialise serialise;
  vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
  ast;
  string *source_local;
  CompileContext *this_local;
  
  std::__cxx11::string::operator=((string *)this,(string *)source);
  Parser::parse((vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
                 *)((long)&serialise.m_ident.field_2 + 8),&this->m_parser);
  serialise.m_ident._M_dataplus = (_Alloc_hider)0x0;
  serialise.m_ident._1_7_ = 0;
  serialise.m_ident._M_string_length = 0;
  serialise.
  super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_ExprVisitor = (_func_int **)0x0;
  serialise.
  super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_PatternVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_PatternVisitor = (_func_int **)0x0;
  auStack_68 = (undefined1  [8])0x0;
  serialise.
  super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  .
  super_StmtVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_StmtVisitor = (_func_int **)0x0;
  serialise.m_ident.field_2._M_allocated_capacity = 0;
  AstSerialise::AstSerialise((AstSerialise *)auStack_68);
  this_00 = (vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
             *)((long)&serialise.m_ident.field_2 + 8);
  __end1 = std::
           vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
           ::begin(this_00);
  stmt = (unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_> *)
         std::
         vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>
         ::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_*,_std::vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>_>
                                *)&stmt);
    if (!bVar2) break;
    local_98 = __gnu_cxx::
               __normal_iterator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_*,_std::vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>_>
               ::operator*(&__end1);
    stmt_00 = std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>::operator*(local_98);
    AstSerialise::operator()[abi_cxx11_(&local_b8,(AstSerialise *)auStack_68,stmt_00);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)&local_b8);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_b8);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_*,_std::vector<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>,_std::allocator<std::unique_ptr<enact::Stmt,_std::default_delete<enact::Stmt>_>_>_>_>
    ::operator++(&__end1);
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

CompileResult CompileContext::compile(std::string source) {
        m_source = std::move(source);

        std::vector<std::unique_ptr<Stmt>> ast = m_parser.parse();
        // TODO: serialise and print AST

        AstSerialise serialise{};
        for (const std::unique_ptr<Stmt>& stmt : ast) {
            std::cout << serialise(*stmt) << '\n';
        }
    }